

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::RemoveFlowControlAttribute
          (ConversionStream *this,iterator *Token)

{
  bool bVar1;
  bool bVar2;
  pointer pHVar3;
  Char *Message;
  pointer pHVar4;
  char (*in_RCX) [23];
  const_iterator local_78;
  const_iterator local_70;
  _Self local_68;
  _Self local_60;
  _Self local_58;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_50;
  iterator PrevToken;
  undefined1 local_38 [8];
  string msg;
  iterator *Token_local;
  ConversionStream *this_local;
  
  msg.field_2._8_8_ = Token;
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  bVar1 = Parsing::HLSLTokenInfo::IsFlowControl(pHVar3);
  if (!bVar1) {
    FormatString<char[26],char[23]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->IsFlowControl()",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"RemoveFlowControlAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x72e);
    std::__cxx11::string::~string((string *)local_38);
  }
  local_50._M_node = *(_List_node_base **)msg.field_2._8_8_;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--(&local_50);
  local_58._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       begin(&this->m_Tokens);
  bVar2 = std::operator==(&local_50,&local_58);
  bVar1 = true;
  if (!bVar2) {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_50);
    bVar1 = pHVar3->Type != ClosingSquareBracket;
  }
  if (!bVar1) {
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--(&local_50);
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         begin(&this->m_Tokens);
    bVar2 = std::operator==(&local_50,&local_60);
    bVar1 = true;
    if (!bVar2) {
      pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_50);
      bVar1 = pHVar3->Type != Identifier;
    }
    if (!bVar1) {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--(&local_50);
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::begin(&this->m_Tokens);
      bVar2 = std::operator==(&local_50,&local_68);
      bVar1 = true;
      if (!bVar2) {
        pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_50);
        bVar1 = pHVar3->Type != OpenSquareBracket;
      }
      if (!bVar1) {
        pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_50);
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)msg.field_2._8_8_);
        std::__cxx11::string::operator=((string *)&pHVar4->Delimiter,(string *)&pHVar3->Delimiter);
        std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                  (&local_70,&local_50);
        std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                  (&local_78,(iterator *)msg.field_2._8_8_);
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        erase(&this->m_Tokens,local_70,local_78);
      }
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::RemoveFlowControlAttribute(TokenListType::iterator& Token)
{
    VERIFY_EXPR(Token->IsFlowControl());
    // [ branch ] if ( ...
    //            ^
    auto PrevToken = Token;
    --PrevToken;
    // [ branch ] if ( ...
    //          ^
    // Note that dummy empty token is inserted into the beginning of the list
    if (PrevToken == m_Tokens.begin() || PrevToken->Type != TokenType::ClosingSquareBracket)
        return;

    --PrevToken;
    // [ branch ] if ( ...
    //   ^
    if (PrevToken == m_Tokens.begin() || PrevToken->Type != TokenType::Identifier)
        return;

    --PrevToken;
    // [ branch ] if ( ...
    // ^
    if (PrevToken == m_Tokens.begin() || PrevToken->Type != TokenType::OpenSquareBracket)
        return;

    //  [ branch ] if ( ...
    //  ^          ^
    // PrevToken   Token
    Token->Delimiter = PrevToken->Delimiter;
    m_Tokens.erase(PrevToken, Token);
}